

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O3

void brotli::FindBlocks<unsigned_char,256>
               (uchar *data,size_t length,double block_switch_bitcost,
               vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *vec,
               uint8_t *block_id)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  void *__s;
  void *__s_00;
  void *__s_01;
  ulong uVar4;
  void *pvVar5;
  size_t j;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  lVar3 = (long)(vec->
                super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4;
  uVar9 = lVar3 * 0xfc0fc0fc0fc0fc1;
  if (uVar9 < 2) {
    if (length == 0) {
      return;
    }
    memset(block_id,0,length);
    return;
  }
  if (0x100 < uVar9) {
    __assert_fail("vecsize <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/block_splitter.cc"
                  ,0xac,
                  "void brotli::FindBlocks(const DataType *, const size_t, const double, const std::vector<Histogram<kSize>> &, uint8_t *) [DataType = unsigned char, kSize = 256]"
                 );
  }
  __s = operator_new__(lVar3 * 0x7e07e07e07e0800);
  lVar6 = 0;
  memset(__s,0,lVar3 * 0x7e07e07e07e0800);
  lVar10 = 0x80;
  do {
    uVar4 = (ulong)((vec->
                    super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->data_[lVar10 * 2];
    if (uVar4 < 0x100) {
      dVar12 = (double)*(float *)(kLog2Table + uVar4 * 4);
    }
    else {
      dVar12 = log2((double)uVar4);
    }
    *(double *)((long)__s + lVar6 * 8) = dVar12;
    lVar6 = lVar6 + 1;
    lVar10 = lVar10 + 0x82;
  } while (uVar9 - lVar6 != 0);
  lVar10 = lVar3 * -0x7627627627627608;
  lVar6 = 0x100;
  lVar7 = 0x3fc;
  do {
    lVar6 = lVar6 + -1;
    lVar11 = 0;
    lVar8 = lVar7;
    do {
      dVar12 = *(double *)((long)__s + lVar11 * 8);
      uVar1 = *(uint *)((long)((vec->
                               super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->data_ + lVar8);
      uVar4 = (ulong)uVar1;
      dVar13 = -2.0;
      if (uVar4 != 0) {
        if (uVar1 < 0x100) {
          dVar13 = (double)*(float *)(kLog2Table + uVar4 * 4);
        }
        else {
          dVar13 = log2((double)uVar4);
        }
      }
      *(double *)((long)__s + lVar11 * 8 + lVar10) = dVar12 - dVar13;
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 0x410;
    } while (uVar9 - lVar11 != 0);
    lVar10 = lVar10 + lVar3 * -0x7e07e07e07e07e08;
    lVar7 = lVar7 + -4;
  } while (lVar6 != 0);
  __s_00 = operator_new__(lVar3 * 0x7e07e07e07e07e08);
  memset(__s_00,0,lVar3 * 0x7e07e07e07e07e08);
  __s_01 = operator_new__(uVar9 * length);
  memset(__s_01,0,uVar9 * length);
  if (length == 0) {
    lVar6 = -1;
  }
  else {
    uVar4 = 0;
    pvVar5 = __s_01;
    do {
      bVar2 = data[uVar4];
      lVar6 = 0;
      dVar12 = 1e+99;
      do {
        dVar13 = *(double *)((long)__s + lVar6 * 8 + bVar2 * uVar9 * 8) +
                 *(double *)((long)__s_00 + lVar6 * 8);
        *(double *)((long)__s_00 + lVar6 * 8) = dVar13;
        if (dVar13 < dVar12) {
          block_id[uVar4] = (uint8_t)lVar6;
          dVar12 = dVar13;
        }
        lVar6 = lVar6 + 1;
      } while (uVar9 - lVar6 != 0);
      dVar13 = block_switch_bitcost;
      if (uVar4 < 2000) {
        dVar13 = (((double)(long)uVar4 * 0.07) / 2000.0 + 0.77) * block_switch_bitcost;
      }
      lVar6 = 0;
      do {
        dVar14 = *(double *)((long)__s_00 + lVar6 * 8) - dVar12;
        *(double *)((long)__s_00 + lVar6 * 8) = dVar14;
        if (dVar13 <= dVar14) {
          *(double *)((long)__s_00 + lVar6 * 8) = dVar13;
          *(undefined1 *)((long)pvVar5 + lVar6) = 1;
        }
        lVar6 = lVar6 + 1;
      } while (uVar9 - lVar6 != 0);
      uVar4 = uVar4 + 1;
      pvVar5 = (void *)((long)pvVar5 + uVar9);
    } while (uVar4 != length);
    lVar6 = length - 1;
    if (lVar6 == 0) goto LAB_0016f855;
  }
  bVar2 = block_id[lVar6];
  pvVar5 = (void *)((long)__s_01 + (length - 2) * uVar9);
  do {
    if (*(char *)((long)pvVar5 + (ulong)bVar2) == '\x01') {
      bVar2 = block_id[length - 2];
    }
    block_id[length - 2] = bVar2;
    pvVar5 = (void *)((long)pvVar5 + lVar3 * -0xfc0fc0fc0fc0fc1);
    length = length - 1;
  } while (length != 1);
LAB_0016f855:
  operator_delete__(__s);
  operator_delete__(__s_00);
  operator_delete__(__s_01);
  return;
}

Assistant:

void FindBlocks(const DataType* data, const size_t length,
                const double block_switch_bitcost,
                const std::vector<Histogram<kSize> > &vec,
                uint8_t *block_id) {
  if (vec.size() <= 1) {
    for (size_t i = 0; i < length; ++i) {
      block_id[i] = 0;
    }
    return;
  }
  size_t vecsize = vec.size();
  assert(vecsize <= 256);
  double* insert_cost = new double[kSize * vecsize];
  memset(insert_cost, 0, sizeof(insert_cost[0]) * kSize * vecsize);
  for (size_t j = 0; j < vecsize; ++j) {
    insert_cost[j] = FastLog2(static_cast<uint32_t>(vec[j].total_count_));
  }
  for (size_t i = kSize; i != 0;) {
    --i;
    for (size_t j = 0; j < vecsize; ++j) {
      insert_cost[i * vecsize + j] = insert_cost[j] - BitCost(vec[j].data_[i]);
    }
  }
  double *cost = new double[vecsize];
  memset(cost, 0, sizeof(cost[0]) * vecsize);
  bool* switch_signal = new bool[length * vecsize];
  memset(switch_signal, 0, sizeof(switch_signal[0]) * length * vecsize);
  // After each iteration of this loop, cost[k] will contain the difference
  // between the minimum cost of arriving at the current byte position using
  // entropy code k, and the minimum cost of arriving at the current byte
  // position. This difference is capped at the block switch cost, and if it
  // reaches block switch cost, it means that when we trace back from the last
  // position, we need to switch here.
  for (size_t byte_ix = 0; byte_ix < length; ++byte_ix) {
    size_t ix = byte_ix * vecsize;
    size_t insert_cost_ix = data[byte_ix] * vecsize;
    double min_cost = 1e99;
    for (size_t k = 0; k < vecsize; ++k) {
      // We are coding the symbol in data[byte_ix] with entropy code k.
      cost[k] += insert_cost[insert_cost_ix + k];
      if (cost[k] < min_cost) {
        min_cost = cost[k];
        block_id[byte_ix] = static_cast<uint8_t>(k);
      }
    }
    double block_switch_cost = block_switch_bitcost;
    // More blocks for the beginning.
    if (byte_ix < 2000) {
      block_switch_cost *= 0.77 + 0.07 * static_cast<double>(byte_ix) / 2000;
    }
    for (size_t k = 0; k < vecsize; ++k) {
      cost[k] -= min_cost;
      if (cost[k] >= block_switch_cost) {
        cost[k] = block_switch_cost;
        switch_signal[ix + k] = true;
      }
    }
  }
  // Now trace back from the last position and switch at the marked places.
  size_t byte_ix = length - 1;
  size_t ix = byte_ix * vecsize;
  uint8_t cur_id = block_id[byte_ix];
  while (byte_ix > 0) {
    --byte_ix;
    ix -= vecsize;
    if (switch_signal[ix + cur_id]) {
      cur_id = block_id[byte_ix];
    }
    block_id[byte_ix] = cur_id;
  }
  delete[] insert_cost;
  delete[] cost;
  delete[] switch_signal;
}